

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void btRemoveRowCol(btScalar *A,int n,int nskip,int r)

{
  int iVar1;
  int i;
  int iVar2;
  int i_1;
  btScalar *pbVar3;
  size_t move_size;
  size_t __n;
  bool bVar4;
  
  iVar1 = n + -1;
  if (r < iVar1) {
    __n = (long)(~r + n) << 2;
    if (0 < r) {
      pbVar3 = A + (ulong)(uint)r + 1;
      iVar2 = r;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        memmove(pbVar3 + -1,pbVar3,__n);
        pbVar3 = pbVar3 + nskip;
      }
      pbVar3 = A + r * nskip;
      for (iVar2 = r; iVar2 < iVar1; iVar2 = iVar2 + 1) {
        memcpy(pbVar3,pbVar3 + nskip,(ulong)(uint)r << 2);
        pbVar3 = pbVar3 + nskip;
      }
    }
    iVar2 = nskip + 1;
    pbVar3 = A + iVar2 * r;
    for (; r < iVar1; r = r + 1) {
      memcpy(pbVar3,pbVar3 + iVar2,__n);
      pbVar3 = pbVar3 + (long)iVar2 + -1;
    }
  }
  return;
}

Assistant:

void btRemoveRowCol (btScalar *A, int n, int nskip, int r)
{
  btAssert(A && n > 0 && nskip >= n && r >= 0 && r < n);
  if (r >= n-1) return;
  if (r > 0) {
    {
      const size_t move_size = (n-r-1)*sizeof(btScalar);
      btScalar *Adst = A + r;
      for (int i=0; i<r; Adst+=nskip,++i) {
        btScalar *Asrc = Adst + 1;
        memmove (Adst,Asrc,move_size);
      }
    }
    {
      const size_t cpy_size = r*sizeof(btScalar);
      btScalar *Adst = A + r * nskip;
      for (int i=r; i<(n-1); ++i) {
        btScalar *Asrc = Adst + nskip;
        memcpy (Adst,Asrc,cpy_size);
        Adst = Asrc;
      }
    }
  }
  {
    const size_t cpy_size = (n-r-1)*sizeof(btScalar);
    btScalar *Adst = A + r * (nskip + 1);
    for (int i=r; i<(n-1); ++i) {
      btScalar *Asrc = Adst + (nskip + 1);
      memcpy (Adst,Asrc,cpy_size);
      Adst = Asrc - 1;
    }
  }
}